

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_helpers.hpp
# Opt level: O1

string * duckdb::NumericHelper::ToString<signed_char>(string *__return_storage_ptr__,char value)

{
  string *__str;
  uint __val;
  uint uVar1;
  uint7 in_register_00000031;
  ulong uVar2;
  
  uVar1 = (uint)CONCAT71(in_register_00000031,value);
  __val = -uVar1;
  if (0 < (int)uVar1) {
    __val = uVar1;
  }
  uVar1 = 1;
  if (9 < __val) {
    uVar1 = 3 - (__val < 100);
  }
  uVar2 = (((ulong)in_register_00000031 & 0x800000) << 8) >> 0x1f;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,(char)uVar1 + (char)uVar2);
  ::std::__detail::__to_chars_10_impl<unsigned_int>
            ((__return_storage_ptr__->_M_dataplus)._M_p + uVar2,uVar1,__val);
  return __return_storage_ptr__;
}

Assistant:

static std::string ToString(T value) {
		return std::to_string(value);
	}